

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

bool QtPrivate::QEqualityOperatorForType<QVector3D,_true>::equals
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  long lVar1;
  QVector3D v2;
  QVector3D v1;
  bool bVar2;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  v1.v[1] = (float)in_stack_ffffffffffffffc4;
  v1.v[0] = (float)*(undefined4 *)(in_RDX + 1);
  v1.v[2] = (float)*in_RSI;
  v2.v._4_8_ = *in_RDX;
  v2.v[0] = (float)((ulong)in_RDI >> 0x20);
  bVar2 = ::operator==(v1,v2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool equals(const QMetaTypeInterface *, const void *a, const void *b)
    { return *reinterpret_cast<const T *>(a) == *reinterpret_cast<const T *>(b); }